

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

Publisher __thiscall miniros::NodeHandle::advertise(NodeHandle *this,AdvertiseOptions *ops)

{
  _Atomic_word *p_Var1;
  TopicManager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
  *this_02;
  bool bVar2;
  int iVar3;
  CallbackQueue *pCVar4;
  TopicManagerPtr *pTVar5;
  AdvertiseOptions *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  pthread_mutex_t *__mutex;
  Publisher PVar7;
  SubscriberCallbacksPtr callbacks;
  weak_ptr<miniros::Publisher::Impl> local_58;
  string local_48;
  
  resolveName(&local_48,(NodeHandle *)ops,&in_RDX->topic,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (in_RDX->callback_queue == (CallbackQueueInterface *)0x0) {
    pCVar4 = (CallbackQueue *)(ops->connect_cb)._M_invoker;
    if (pCVar4 == (CallbackQueue *)0x0) {
      pCVar4 = getGlobalCallbackQueue();
    }
    in_RDX->callback_queue = &pCVar4->super_CallbackQueueInterface;
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::SubscriberCallbacks,std::allocator<miniros::SubscriberCallbacks>,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<void_const>&,miniros::CallbackQueueInterface*&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length,
             (SubscriberCallbacks **)&local_48,(allocator<miniros::SubscriberCallbacks> *)&local_58,
             &in_RDX->connect_cb,&in_RDX->disconnect_cb,&in_RDX->tracked_object,
             &in_RDX->callback_queue);
  pTVar5 = TopicManager::instance();
  this_00 = (pTVar5->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (pTVar5->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  bVar2 = TopicManager::advertise(this_00,in_RDX,(SubscriberCallbacksPtr *)&local_48);
  _Var6._M_pi = extraout_RDX;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (bVar2) {
    Publisher::Publisher
              ((Publisher *)this,&in_RDX->topic,&in_RDX->md5sum,&in_RDX->datatype,(NodeHandle *)ops,
               (SubscriberCallbacksPtr *)&local_48);
    __mutex = (pthread_mutex_t *)
              (*(long *)&(ops->disconnect_cb).super__Function_base._M_functor + 0x60);
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    this_02 = *(vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
                **)&(ops->disconnect_cb).super__Function_base._M_functor;
    local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this->namespace_)._M_dataplus._M_p;
    local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->namespace_)._M_string_length;
    if (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_weak_count =
             (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_weak_count =
             (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    std::
    vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::Publisher::Impl>>(this_02,&local_58);
    if (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_58.super___weak_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    pthread_mutex_unlock(__mutex);
    _Var6._M_pi = extraout_RDX_01;
  }
  else {
    (this->namespace_)._M_dataplus._M_p = (pointer)0x0;
    (this->namespace_)._M_string_length = 0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    _Var6._M_pi = extraout_RDX_02;
  }
  PVar7.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  PVar7.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Publisher)
         PVar7.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Publisher NodeHandle::advertise(AdvertiseOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  SubscriberCallbacksPtr callbacks(std::make_shared<SubscriberCallbacks>(ops.connect_cb, ops.disconnect_cb, 
                                                                           ops.tracked_object, ops.callback_queue));

  if (getTopicManager()->advertise(ops, callbacks))
  {
    Publisher pub(ops.topic, ops.md5sum, ops.datatype, *this, callbacks);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->pubs_.push_back(pub.impl_);
    }

    return pub;
  }

  return Publisher();
}